

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::~IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68 =
       0x907f28;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.have =
       0x907f50;
  if ((bool *)this[-1].Girth != &this[-1].InternalFilletRadius.have) {
    operator_delete((undefined1 *)this[-1].Girth);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if ((Out *)puVar1 != &this[-1].Width) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}